

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nfrs.cpp
# Opt level: O3

void __thiscall
icu_63::NFRuleSet::NFRuleSet
          (NFRuleSet *this,RuleBasedNumberFormat *_owner,UnicodeString *descriptions,int32_t index,
          UErrorCode *status)

{
  UnicodeString *this_00;
  char16_t *pcVar1;
  short sVar2;
  ushort uVar3;
  UBool UVar4;
  int8_t iVar5;
  ushort uVar6;
  int32_t iVar7;
  NFRule **ppNVar8;
  int iVar9;
  char16_t *pcVar10;
  int32_t length;
  uint uVar11;
  uint uVar12;
  UnicodeString *this_01;
  long lVar13;
  ConstChar16Ptr local_98;
  undefined1 *local_90;
  char16_t *local_80;
  UnicodeString local_70;
  
  this_00 = &this->name;
  (this->name).super_Replaceable.super_UObject._vptr_UObject =
       (_func_int **)&PTR__UnicodeString_003be258;
  (this->name).fUnion.fStackFields.fLengthAndFlags = 2;
  (this->rules).fStuff = (NFRule **)0x0;
  (this->rules).fCount = 0;
  (this->rules).fCapacity = 0;
  this->owner = _owner;
  ppNVar8 = (NFRule **)uprv_malloc_63(0x50);
  (this->fractionRules).fStuff = ppNVar8;
  (this->fractionRules).fCount = 0;
  (this->fractionRules).fCapacity = 10;
  this->fIsFractionRuleSet = '\0';
  this->fIsPublic = '\0';
  this->fIsParseable = '\x01';
  this->nonNumericalRules[0] = (NFRule *)0x0;
  this->nonNumericalRules[1] = (NFRule *)0x0;
  this->nonNumericalRules[2] = (NFRule *)0x0;
  this->nonNumericalRules[3] = (NFRule *)0x0;
  this->nonNumericalRules[4] = (NFRule *)0x0;
  this->nonNumericalRules[5] = (NFRule *)0x0;
  if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
    sVar2 = descriptions[index].fUnion.fStackFields.fLengthAndFlags;
    if (sVar2 < 0) {
      iVar9 = descriptions[index].fUnion.fFields.fLength;
    }
    else {
      iVar9 = (int)sVar2 >> 5;
    }
    if (iVar9 == 0) {
      *status = U_PARSE_ERROR;
    }
    else {
      this_01 = descriptions + index;
      pcVar1 = (this_01->fUnion).fStackFields.fBuffer;
      pcVar10 = pcVar1;
      if (((int)sVar2 & 2U) == 0) {
        pcVar10 = (this_01->fUnion).fFields.fArray;
      }
      if (*pcVar10 == L'%') {
        iVar7 = UnicodeString::doIndexOf(this_01,L':',0,iVar9);
        if (iVar7 == -1) {
          *status = U_PARSE_ERROR;
        }
        else {
          UnicodeString::unBogus(this_00);
          sVar2 = (this->name).fUnion.fStackFields.fLengthAndFlags;
          if (sVar2 < 0) {
            length = (this->name).fUnion.fFields.fLength;
          }
          else {
            length = (int)sVar2 >> 5;
          }
          UnicodeString::doReplace(this_00,0,length,this_01,0,iVar7);
          lVar13 = (long)iVar7;
          do {
            sVar2 = (this_01->fUnion).fStackFields.fLengthAndFlags;
            if (sVar2 < 0) {
              uVar11 = (this_01->fUnion).fFields.fLength;
            }
            else {
              uVar11 = (int)sVar2 >> 5;
            }
            if ((int)uVar11 <= lVar13) break;
            uVar12 = 0xffff;
            if ((int)lVar13 + 1U < uVar11) {
              pcVar10 = pcVar1;
              if (((int)sVar2 & 2U) == 0) {
                pcVar10 = (this_01->fUnion).fFields.fArray;
              }
              uVar12 = (uint)(ushort)pcVar10[lVar13 + 1];
            }
            UVar4 = PatternProps::isWhiteSpace(uVar12);
            lVar13 = lVar13 + 1;
          } while (UVar4 != '\0');
          if ((int)lVar13 == 0x7fffffff) {
            uVar3 = (this_01->fUnion).fStackFields.fLengthAndFlags;
            uVar6 = 2;
            if ((uVar3 & 1) == 0) {
              uVar6 = uVar3 & 0x1e;
            }
            (this_01->fUnion).fStackFields.fLengthAndFlags = uVar6;
          }
          else {
            UnicodeString::doReplace(this_01,0,(int)lVar13,(UChar *)0x0,0,0);
          }
        }
      }
      else {
        local_98.p_ = L"%default";
        UnicodeString::UnicodeString(&local_70,'\x01',&local_98,-1);
        UnicodeString::copyFrom(this_00,&local_70,'\0');
        UnicodeString::~UnicodeString(&local_70);
        local_80 = local_98.p_;
      }
      sVar2 = (this_01->fUnion).fStackFields.fLengthAndFlags;
      if (sVar2 < 0) {
        iVar9 = (this_01->fUnion).fFields.fLength;
      }
      else {
        iVar9 = (int)sVar2 >> 5;
      }
      if (iVar9 == 0) {
        *status = U_PARSE_ERROR;
      }
      sVar2 = (this->name).fUnion.fStackFields.fLengthAndFlags;
      if (sVar2 < 0) {
        uVar11 = (this->name).fUnion.fFields.fLength;
      }
      else {
        uVar11 = (int)sVar2 >> 5;
      }
      uVar12 = (int)uVar11 >> 0x1f & uVar11;
      iVar7 = UnicodeString::indexOf(this_00,L"%%",0,2,uVar12,uVar11 - uVar12);
      this->fIsPublic = iVar7 != 0;
      sVar2 = (this->name).fUnion.fStackFields.fLengthAndFlags;
      if (sVar2 < 0) {
        iVar9 = (this->name).fUnion.fFields.fLength;
      }
      else {
        iVar9 = (int)sVar2 >> 5;
      }
      iVar5 = UnicodeString::doCompare(this_00,iVar9 + -8,8,(UChar *)gNoparse,0,8);
      local_90 = gNoparse;
      if (iVar5 == '\0') {
        this->fIsParseable = '\0';
        uVar3 = (this->name).fUnion.fStackFields.fLengthAndFlags;
        if ((short)uVar3 < 0) {
          uVar11 = (this->name).fUnion.fFields.fLength;
        }
        else {
          uVar11 = (int)(short)uVar3 >> 5;
        }
        iVar9 = uVar11 - 8;
        if (iVar9 == 0 && (uVar3 & 1) != 0) {
          UnicodeString::unBogus(this_00);
        }
        else if (7 < uVar11) {
          if ((int)uVar11 < 0x408) {
            (this->name).fUnion.fStackFields.fLengthAndFlags = (short)iVar9 * 0x20 | uVar3 & 0x1f;
          }
          else {
            (this->name).fUnion.fStackFields.fLengthAndFlags = uVar3 | 0xffe0;
            (this->name).fUnion.fFields.fLength = iVar9;
          }
        }
      }
    }
  }
  return;
}

Assistant:

NFRuleSet::NFRuleSet(RuleBasedNumberFormat *_owner, UnicodeString* descriptions, int32_t index, UErrorCode& status)
  : name()
  , rules(0)
  , owner(_owner)
  , fractionRules()
  , fIsFractionRuleSet(FALSE)
  , fIsPublic(FALSE)
  , fIsParseable(TRUE)
{
    for (int32_t i = 0; i < NON_NUMERICAL_RULE_LENGTH; ++i) {
        nonNumericalRules[i] = NULL;
    }

    if (U_FAILURE(status)) {
        return;
    }

    UnicodeString& description = descriptions[index]; // !!! make sure index is valid

    if (description.length() == 0) {
        // throw new IllegalArgumentException("Empty rule set description");
        status = U_PARSE_ERROR;
        return;
    }

    // if the description begins with a rule set name (the rule set
    // name can be omitted in formatter descriptions that consist
    // of only one rule set), copy it out into our "name" member
    // and delete it from the description
    if (description.charAt(0) == gPercent) {
        int32_t pos = description.indexOf(gColon);
        if (pos == -1) {
            // throw new IllegalArgumentException("Rule set name doesn't end in colon");
            status = U_PARSE_ERROR;
        } else {
            name.setTo(description, 0, pos);
            while (pos < description.length() && PatternProps::isWhiteSpace(description.charAt(++pos))) {
            }
            description.remove(0, pos);
        }
    } else {
        name.setTo(UNICODE_STRING_SIMPLE("%default"));
    }

    if (description.length() == 0) {
        // throw new IllegalArgumentException("Empty rule set description");
        status = U_PARSE_ERROR;
    }

    fIsPublic = name.indexOf(gPercentPercent, 2, 0) != 0;

    if ( name.endsWith(gNoparse,8) ) {
        fIsParseable = FALSE;
        name.truncate(name.length()-8); // remove the @noparse from the name
    }

    // all of the other members of NFRuleSet are initialized
    // by parseRules()
}